

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_lock.cpp
# Opt level: O2

void mpp_spinlock_lock(spinlock_t *lock)

{
  RK_S64 RVar1;
  RK_S64 RVar2;
  bool bVar3;
  
  if (lock->debug == 0) {
    RVar1 = 0;
  }
  else {
    RVar1 = mpp_time();
  }
  do {
    LOCK();
    bVar3 = lock->lock == 0;
    if (bVar3) {
      lock->lock = 1;
    }
    UNLOCK();
  } while (!bVar3);
  if (RVar1 != 0 && lock->debug != 0) {
    RVar2 = mpp_time();
    lock->count = lock->count + 1;
    lock->time = (RVar2 - RVar1) + lock->time;
  }
  return;
}

Assistant:

void mpp_spinlock_lock(spinlock_t *lock)
{
    RK_S64 time = 0;

    if (lock->debug)
        time = mpp_time();

    while (!MPP_BOOL_CAS(&lock->lock, LOCK_IDLE, LOCK_BUSY)) {
        asm("NOP");
        asm("NOP");
    }

    if (lock->debug && time) {
        lock->time += mpp_time() - time;
        lock->count++;
    }
}